

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O1

void * __thiscall irr::scene::SSkinMeshBuffer::getVertices(SSkinMeshBuffer *this)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  if (this->VertexType == EVT_2TCOORDS) {
    lVar4 = 0x30;
    lVar2 = 0x28;
  }
  else if (this->VertexType == EVT_TANGENTS) {
    lVar4 = 0x10;
    lVar2 = 8;
  }
  else {
    lVar4 = 0x50;
    lVar2 = 0x48;
  }
  pvVar1 = *(void **)((long)&(this->super_IMeshBuffer)._vptr_IMeshBuffer + lVar2);
  pvVar3 = (void *)0x0;
  if (pvVar1 != *(void **)((long)&(this->super_IMeshBuffer)._vptr_IMeshBuffer + lVar4)) {
    pvVar3 = pvVar1;
  }
  return pvVar3;
}

Assistant:

const void *getVertices() const override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords.const_pointer();
		case video::EVT_TANGENTS:
			return Vertices_Tangents.const_pointer();
		default:
			return Vertices_Standard.const_pointer();
		}
	}